

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
pg::ZLKPPSolver::solve
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ZLKPPSolver *this,
          int max_priority,int prec_cur,int prec_opo,bool *reached_bottom_cur,
          bool *reached_bottom_opo)

{
  bool bVar1;
  int iVar2;
  bool reached_bottom_opo_last;
  int local_88;
  int num_nodes_in_h;
  vector<int,_std::allocator<int>_> *local_80;
  vector<int,_std::allocator<int>_> saved_nodes;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_80 = __return_storage_ptr__;
  if (this->cur_num_nodes == 0) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    local_88 = prec_opo;
    get_cur_nodes(&saved_nodes,this);
    iVar2 = this->variant;
    if (iVar2 == 2) {
      solve_liverpool(this,max_priority,prec_cur,local_88,reached_bottom_cur,reached_bottom_opo);
    }
    else if (iVar2 == 1) {
      iVar2 = local_88 / 2;
      do {
        reached_bottom_opo_last = false;
        bVar1 = do_step(this,max_priority,prec_cur,iVar2,&num_nodes_in_h,reached_bottom_cur,
                        &reached_bottom_opo_last);
        *reached_bottom_opo = (bool)(*reached_bottom_opo | reached_bottom_opo_last);
      } while (bVar1);
      if (((iVar2 < num_nodes_in_h) && (reached_bottom_opo_last != false)) &&
         (bVar1 = do_step(this,max_priority,prec_cur,local_88,&num_nodes_in_h,reached_bottom_cur,
                          reached_bottom_opo), bVar1)) {
        do {
          bVar1 = do_step(this,max_priority,prec_cur,iVar2,&num_nodes_in_h,reached_bottom_cur,
                          reached_bottom_opo);
        } while (bVar1);
      }
    }
    else if (iVar2 == 0) {
      do {
        bVar1 = do_step(this,max_priority,prec_cur,local_88,&num_nodes_in_h,reached_bottom_cur,
                        reached_bottom_opo);
      } while (bVar1);
    }
    get_nodes_of_max_priority((vector<int,_std::allocator<int>_> *)&local_48,this,max_priority);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    get_cur_nodes(local_80,this);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_60,&saved_nodes);
    set_cur_nodes(this,(vector<int,_std::allocator<int>_> *)&local_60);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&saved_nodes.super__Vector_base<int,_std::allocator<int>_>);
  }
  return local_80;
}

Assistant:

std::vector<int> ZLKPPSolver::solve(int max_priority, int prec_cur, int prec_opo, bool &reached_bottom_cur, bool &reached_bottom_opo) {
    if (!cur_num_nodes)
        return std::vector<int>();
    auto saved_nodes = get_cur_nodes();
    int num_nodes_in_h;
    switch (variant) {

    case ZLK_STANDARD:
        while (do_step(max_priority, prec_cur, prec_opo, num_nodes_in_h, reached_bottom_cur, reached_bottom_opo));
        break;

    case ZLK_WARSAW:
        bool reached_bottom_opo_last, atr_greater;
        atr_greater = true;
        while (atr_greater) {
            reached_bottom_opo_last = false;
            atr_greater = do_step(max_priority, prec_cur, prec_opo / 2, num_nodes_in_h, reached_bottom_cur, reached_bottom_opo_last);
            reached_bottom_opo |= reached_bottom_opo_last;
        }
        if (num_nodes_in_h <= prec_opo / 2 || !reached_bottom_opo_last)
            break;
        if (do_step(max_priority, prec_cur, prec_opo, num_nodes_in_h, reached_bottom_cur, reached_bottom_opo))
            while (do_step(max_priority, prec_cur, prec_opo / 2, num_nodes_in_h, reached_bottom_cur, reached_bottom_opo));
        break;
    
    case ZLK_LIVERPOOL:
        solve_liverpool(max_priority, prec_cur, prec_opo, reached_bottom_cur, reached_bottom_opo);
        break;
    }
    
    // we should set strategy in nodes of maximal priority to an arbitrary node that remains in the subgame now:
    get_nodes_of_max_priority(max_priority);

    auto winning_region = get_cur_nodes();
    set_cur_nodes(saved_nodes); // the current game remains unchanged at the end
    return winning_region;
}